

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_sink.cpp
# Opt level: O0

Status __thiscall spvtools::opt::CodeSinkingPass::Process(CodeSinkingPass *this)

{
  bool bVar1;
  Status SVar2;
  Module *this_00;
  CFG *this_01;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *this_02;
  pointer bb;
  anon_class_16_2_3b81a10e local_78;
  function<void_(spvtools::opt::BasicBlock_*)> local_68;
  Function *local_48;
  Function *function;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  CodeSinkingPass *pCStack_10;
  bool modified;
  CodeSinkingPass *this_local;
  
  __range2._7_1_ = 0;
  pCStack_10 = this;
  this_00 = Pass::get_module(&this->super_Pass);
  join_0x00000010_0x00000000_ = Module::begin(this_00);
  _function = Module::end(this_00);
  while( true ) {
    bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_,
                       (UptrVectorIterator<spvtools::opt::Function,_false> *)&function);
    if (!bVar1) break;
    local_48 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                         ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
    this_01 = Pass::cfg(&this->super_Pass);
    this_02 = opt::Function::entry(local_48);
    bb = std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
         ::get(this_02);
    local_78.modified = (bool *)((long)&__range2 + 7);
    local_78.this = this;
    std::function<void(spvtools::opt::BasicBlock*)>::
    function<spvtools::opt::CodeSinkingPass::Process()::__0,void>
              ((function<void(spvtools::opt::BasicBlock*)> *)&local_68,&local_78);
    CFG::ForEachBlockInPostOrder(this_01,bb,&local_68);
    std::function<void_(spvtools::opt::BasicBlock_*)>::~function(&local_68);
    UptrVectorIterator<spvtools::opt::Function,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
  }
  SVar2 = SuccessWithoutChange;
  if ((__range2._7_1_ & 1) != 0) {
    SVar2 = SuccessWithChange;
  }
  return SVar2;
}

Assistant:

Pass::Status CodeSinkingPass::Process() {
  bool modified = false;
  for (Function& function : *get_module()) {
    cfg()->ForEachBlockInPostOrder(function.entry().get(),
                                   [&modified, this](BasicBlock* bb) {
                                     if (SinkInstructionsInBB(bb)) {
                                       modified = true;
                                     }
                                   });
  }
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}